

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::BasicUsageNoOffset::Run(BasicUsageNoOffset *this)

{
  bool bVar1;
  GLuint GVar2;
  undefined4 *puVar3;
  uint *__first;
  uint local_74;
  int i;
  GLuint *data;
  long error;
  uint *ptr;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicUsageNoOffset *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nlayout(binding = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0) uniform atomic_uint ac_counter_dec;\nlayout(std430) buffer Output {\n  mediump uint data_inc[256];\n  mediump uint data_dec[256];\n} g_out;\nvoid main() {\n  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);\n  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nlayout(binding = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0) uniform atomic_uint ac_counter_dec;\nlayout(std430) buffer Output {\n  mediump uint data_inc[256];\n  mediump uint data_dec[256];\n} g_out;\nvoid main() {\n  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);\n  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);\n}"
             ,&local_41);
  GVar2 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_40);
  this->prog_ = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->prog_);
  bVar1 = BasicUsageCS::CheckProgram(&this->super_BasicUsageCS,this->prog_,(bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,8,(void *)0x0,0x88ea);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    puVar3 = (undefined4 *)
             glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x92c0,0,8,10);
    *puVar3 = 0;
    puVar3[1] = 0x100;
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x800,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->prog_);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,1,1);
    data = (GLuint *)0x0;
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_buffer);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    __first = (uint *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x800,3);
    std::sort<unsigned_int*>(__first,__first + 0x200);
    for (local_74 = 0; (int)local_74 < 0x200; local_74 = local_74 + 2) {
      if (__first[(int)local_74] != __first[(int)(local_74 + 1)]) {
        glcts::anon_unknown_0::Output
                  ("Pair of values should be equal, got: %d, %d\n",(ulong)__first[(int)local_74],
                   (ulong)__first[(int)(local_74 + 1)]);
        data = (GLuint *)&DAT_ffffffffffffffff;
      }
      if (((int)local_74 < 0x1fe) && (__first[(int)local_74] == __first[(int)(local_74 + 2)])) {
        glcts::anon_unknown_0::Output
                  ("Too many same values found: %d, index: %d\n",(ulong)__first[(int)local_74],
                   (ulong)local_74);
        data = (GLuint *)&DAT_ffffffffffffffff;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    this_local = (BasicUsageNoOffset *)data;
  }
  else {
    this_local = (BasicUsageNoOffset *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* const glsl_cs =
			NL "layout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;" NL
			   "layout(binding = 0) uniform atomic_uint ac_counter_inc;" NL
			   "layout(binding = 0) uniform atomic_uint ac_counter_dec;" NL "layout(std430) buffer Output {" NL
			   "  mediump uint data_inc[256];" NL "  mediump uint data_dec[256];" NL "} g_out;" NL "void main() {" NL
			   "  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			   "  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);" NL
			   "  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);" NL "}";
		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr++ = 0;
		*ptr++ = 256;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 512 * sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(prog_);
		glDispatchCompute(4, 1, 1);

		long	error = NO_ERROR;
		GLuint* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 512 * sizeof(GLuint), GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));

		std::sort(data, data + 512);
		for (int i = 0; i < 512; i += 2)
		{
			if (data[i] != data[i + 1])
			{
				Output("Pair of values should be equal, got: %d, %d\n", data[i], data[i + 1]);
				error = ERROR;
			}
			if (i < 510 && data[i] == data[i + 2])
			{
				Output("Too many same values found: %d, index: %d\n", data[i], i);
				error = ERROR;
			}
		}

		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}